

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNumberTreeObjectHelper.cc
# Opt level: O0

bool __thiscall
QPDFNumberTreeObjectHelper::findObjectAtOrBelow
          (QPDFNumberTreeObjectHelper *this,numtree_number idx,QPDFObjectHandle *oh,
          numtree_number *offset)

{
  QPDFObjectHandle *pQVar1;
  bool bVar2;
  pointer pTVar3;
  iterator local_90;
  undefined1 local_60 [8];
  iterator i;
  numtree_number *offset_local;
  QPDFObjectHandle *oh_local;
  numtree_number idx_local;
  QPDFNumberTreeObjectHelper *this_local;
  
  i.ivalue.second.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)offset;
  oh_local = (QPDFObjectHandle *)idx;
  idx_local = (numtree_number)this;
  find((iterator *)local_60,this,idx,true);
  end(&local_90,this);
  bVar2 = iterator::operator==((iterator *)local_60,&local_90);
  iterator::~iterator(&local_90);
  if (!bVar2) {
    pTVar3 = iterator::operator->((iterator *)local_60);
    QPDFObjectHandle::operator=(oh,&pTVar3->second);
    pTVar3 = iterator::operator->((iterator *)local_60);
    QIntC::range_check_subtract<long_long>((longlong *)&oh_local,&pTVar3->first);
    pQVar1 = oh_local;
    pTVar3 = iterator::operator->((iterator *)local_60);
    (i.ivalue.second.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
     ._M_refcount._M_pi)->_vptr__Sp_counted_base = (_func_int **)((long)pQVar1 - pTVar3->first);
  }
  this_local._7_1_ = !bVar2;
  iterator::~iterator((iterator *)local_60);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool
QPDFNumberTreeObjectHelper::findObjectAtOrBelow(
    numtree_number idx, QPDFObjectHandle& oh, numtree_number& offset)
{
    auto i = find(idx, true);
    if (i == end()) {
        return false;
    }
    oh = i->second;
    QIntC::range_check_subtract(idx, i->first);
    offset = idx - i->first;
    return true;
}